

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_gainer_init_preallocated(ma_gainer_config *pConfig,void *pHeap,ma_gainer *pGainer)

{
  uint local_6c;
  undefined1 auStack_68 [4];
  ma_uint32 iChannel;
  ma_gainer_heap_layout heapLayout;
  ma_result result;
  ma_gainer *pGainer_local;
  void *pHeap_local;
  ma_gainer_config *pConfig_local;
  
  if (pGainer == (ma_gainer *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    memset(pGainer,0,0x30);
    if ((pConfig == (ma_gainer_config *)0x0) || (pHeap == (void *)0x0)) {
      pConfig_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      heapLayout.newGainsOffset._4_4_ =
           ma_gainer_get_heap_layout(pConfig,(ma_gainer_heap_layout *)auStack_68);
      pConfig_local._4_4_ = heapLayout.newGainsOffset._4_4_;
      if (heapLayout.newGainsOffset._4_4_ == MA_SUCCESS) {
        pGainer->_pHeap = pHeap;
        if (_auStack_68 != 0) {
          memset(pHeap,0,_auStack_68);
        }
        pGainer->pOldGains = (float *)((long)pHeap + heapLayout.sizeInBytes);
        pGainer->pNewGains = (float *)((long)pHeap + heapLayout.oldGainsOffset);
        pGainer->config = *pConfig;
        pGainer->t = 0xffffffff;
        for (local_6c = 0; local_6c < pConfig->channels; local_6c = local_6c + 1) {
          pGainer->pOldGains[local_6c] = 1.0;
          pGainer->pNewGains[local_6c] = 1.0;
        }
        pConfig_local._4_4_ = MA_SUCCESS;
      }
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_gainer_init_preallocated(const ma_gainer_config* pConfig, void* pHeap, ma_gainer* pGainer)
{
    ma_result result;
    ma_gainer_heap_layout heapLayout;
    ma_uint32 iChannel;

    if (pGainer == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pGainer);

    if (pConfig == NULL || pHeap == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_gainer_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pGainer->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pGainer->pOldGains = (float*)ma_offset_ptr(pHeap, heapLayout.oldGainsOffset);
    pGainer->pNewGains = (float*)ma_offset_ptr(pHeap, heapLayout.newGainsOffset);

    pGainer->config = *pConfig;
    pGainer->t      = (ma_uint32)-1;  /* No interpolation by default. */

    for (iChannel = 0; iChannel < pConfig->channels; iChannel += 1) {
        pGainer->pOldGains[iChannel] = 1;
        pGainer->pNewGains[iChannel] = 1;
    }

    return MA_SUCCESS;
}